

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator
          (LoopPeelingInfo *this,CmpOperator cmp_op,SExpression lhs,SExpression rhs,bool *result)

{
  bool bVar1;
  SENode *pSVar2;
  SENode *pSVar3;
  ScalarEvolutionAnalysis *this_00;
  SENode *node;
  ScalarEvolutionAnalysis *pSVar4;
  ScalarEvolutionAnalysis *this_01;
  
  this_00 = lhs.scev_;
  node = lhs.node_;
  this_01 = rhs.scev_;
  pSVar3 = rhs.node_;
  bVar1 = ScalarEvolutionAnalysis::IsLoopInvariant(this->scev_analysis_,this->loop_,node);
  if (!bVar1) {
    __assert_fail("scev_analysis_->IsLoopInvariant(loop_, lhs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x3c3,
                  "bool spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator, SExpression, SExpression, bool *) const"
                 );
  }
  bVar1 = ScalarEvolutionAnalysis::IsLoopInvariant(this->scev_analysis_,this->loop_,pSVar3);
  if (!bVar1) {
    __assert_fail("scev_analysis_->IsLoopInvariant(loop_, rhs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x3c4,
                  "bool spvtools::opt::LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator, SExpression, SExpression, bool *) const"
                 );
  }
  switch(cmp_op) {
  case kLT:
    pSVar4 = this->scev_analysis_;
    pSVar2 = ScalarEvolutionAnalysis::CreateNegation(this_01,node);
    break;
  case kGT:
    pSVar4 = this->scev_analysis_;
    pSVar2 = ScalarEvolutionAnalysis::CreateNegation(this_00,pSVar3);
    pSVar3 = node;
    this_01 = this_00;
    break;
  case kLE:
    pSVar4 = this->scev_analysis_;
    pSVar2 = ScalarEvolutionAnalysis::CreateNegation(this_01,node);
    goto LAB_00250d98;
  case kGE:
    pSVar4 = this->scev_analysis_;
    pSVar2 = ScalarEvolutionAnalysis::CreateNegation(this_00,pSVar3);
    pSVar3 = node;
    this_01 = this_00;
LAB_00250d98:
    pSVar3 = ScalarEvolutionAnalysis::CreateAddNode(this_01,pSVar3,pSVar2);
    pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar3->parent_analysis_,pSVar3);
    bVar1 = ScalarEvolutionAnalysis::IsAlwaysGreaterOrEqualToZero(pSVar4,pSVar3,result);
    return bVar1;
  default:
    return false;
  }
  pSVar3 = ScalarEvolutionAnalysis::CreateAddNode(this_01,pSVar3,pSVar2);
  pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar3->parent_analysis_,pSVar3);
  bVar1 = ScalarEvolutionAnalysis::IsAlwaysGreaterThanZero(pSVar4,pSVar3,result);
  return bVar1;
}

Assistant:

bool LoopPeelingPass::LoopPeelingInfo::EvalOperator(CmpOperator cmp_op,
                                                    SExpression lhs,
                                                    SExpression rhs,
                                                    bool* result) const {
  assert(scev_analysis_->IsLoopInvariant(loop_, lhs));
  assert(scev_analysis_->IsLoopInvariant(loop_, rhs));
  // We perform the test: 0 cmp_op rhs - lhs
  // What is left is then to determine the sign of the expression.
  switch (cmp_op) {
    case CmpOperator::kLT: {
      return scev_analysis_->IsAlwaysGreaterThanZero(rhs - lhs, result);
    }
    case CmpOperator::kGT: {
      return scev_analysis_->IsAlwaysGreaterThanZero(lhs - rhs, result);
    }
    case CmpOperator::kLE: {
      return scev_analysis_->IsAlwaysGreaterOrEqualToZero(rhs - lhs, result);
    }
    case CmpOperator::kGE: {
      return scev_analysis_->IsAlwaysGreaterOrEqualToZero(lhs - rhs, result);
    }
  }
  return false;
}